

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall wallet::LegacyDataSPKM::DeleteRecords(LegacyDataSPKM *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  WalletBatch local_30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  WalletDatabase *pWVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock52,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x7eb,false);
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_30,pWVar4,1);
  local_30.m_database = pWVar4;
  bVar2 = WalletBatch::EraseRecords
                    (&local_30,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)DBKeys::LEGACY_TYPES_abi_cxx11_);
  if (local_30.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_30.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock52.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::DeleteRecords()
{
    LOCK(cs_KeyStore);
    WalletBatch batch(m_storage.GetDatabase());
    return batch.EraseRecords(DBKeys::LEGACY_TYPES);
}